

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm_endian.cc
# Opt level: O1

uint32_t libwebm::host_to_bigendian(uint32_t value)

{
  return value >> 8 & 0xff0000 | (value & 0xff) << 8 | value << 0x18 | value >> 0x18;
}

Assistant:

uint32_t swap32_check_little_endian(uint32_t value) {
  // Check endianness.
  union {
    uint32_t val32;
    uint8_t c[4];
  } check;
  check.val32 = 0x01234567U;

  // Check for big endian.
  if (check.c[3] == 0x67)
    return value;

  // Check for not little endian.
  if (check.c[0] != 0x67)
    return 0;

  return value << 24 | ((value << 8) & 0x0000FF00U) |
         ((value >> 8) & 0x00FF0000U) | value >> 24;
}